

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::PricingSession::OnSubscriptionStatus
          (PricingSession *this,Subject *subject,SubscriptionStatus status,string *reason)

{
  function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *pfVar1;
  iterator iVar2;
  undefined8 uVar3;
  function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *__x;
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> event;
  function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> callback;
  SubscriptionStatus local_6c;
  SubscriptionStatusEvent *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (((this->running_)._M_base._M_i & 1U) != 0) {
    local_6c = status;
    iVar2 = std::
            _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
            ::find(&(this->subscriptions_)._M_t,subject);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->subscriptions_)._M_t._M_impl.super__Rb_tree_header) {
      Subscription::SetStatus((Subscription *)&iVar2._M_node[1]._M_right,local_6c);
      Subscription::ClearPriceFields((Subscription *)&iVar2._M_node[1]._M_right);
    }
    local_68 = (SubscriptionStatusEvent *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bidfx_public_api::SubscriptionStatusEvent,std::allocator<bidfx_public_api::SubscriptionStatusEvent>,bidfx_public_api::price::subject::Subject_const&,bidfx_public_api::SubscriptionStatus&,std::__cxx11::string&>
              (&local_60,&local_68,(allocator<bidfx_public_api::SubscriptionStatusEvent> *)&local_48
               ,subject,&local_6c,reason);
    __x = (this->subscription_status_callback_).
          super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pfVar1 = (this->subscription_status_callback_).
             super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__x != pfVar1) {
      do {
        std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::function
                  ((function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *)
                   &local_48,__x);
        local_58.
        super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_68;
        local_58.
        super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_60._M_pi;
        if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
          }
        }
        if (local_38 == (code *)0x0) {
          uVar3 = std::__throw_bad_function_call();
          __clang_call_terminate(uVar3);
        }
        (*local_30)(&local_48,&local_58);
        if (local_58.
            super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.
                     super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
        __x = __x + 1;
      } while (__x != pfVar1);
    }
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
  }
  return;
}

Assistant:

void PricingSession::OnSubscriptionStatus(const Subject& subject, SubscriptionStatus status, std::string reason)
{
    if (!running_)
    {
        return;
    }
    auto subscription_it = subscriptions_.find(subject);
    if (subscription_it != subscriptions_.end())
    {
        subscription_it->second.SetStatus(status);
        subscription_it->second.ClearPriceFields();
    }

    std::shared_ptr<SubscriptionStatusEvent> event = std::make_shared<SubscriptionStatusEvent>(subject, status, reason);
    try
    {
        for (auto callback : subscription_status_callback_)
        {
            callback(event);
        }
    }
    catch (std::exception &e)
    {
        Log->warn("error handling price status {}", e.what());
        throw e;
    }
}